

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm.c
# Opt level: O2

double * inform_tpm(int *series,size_t n,size_t m,int b,double *tpm,inform_error *err)

{
  uint *puVar1;
  inform_error iVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  double *pdVar7;
  size_t sVar8;
  ulong uVar9;
  double sum;
  double dVar10;
  
  if (series == (int *)0x0) {
    if (err == (inform_error *)0x0) {
      return (double *)0x0;
    }
    iVar2 = INFORM_ETIMESERIES;
  }
  else if (n == 0) {
    if (err == (inform_error *)0x0) {
      return (double *)0x0;
    }
    iVar2 = INFORM_ENOINITS;
  }
  else if (m < 2) {
    if (err == (inform_error *)0x0) {
      return (double *)0x0;
    }
    iVar2 = INFORM_ESHORTSERIES;
  }
  else if (b < 2) {
    if (err == (inform_error *)0x0) {
      return (double *)0x0;
    }
    iVar2 = INFORM_EBIN;
  }
  else {
    lVar4 = 0;
    do {
      if (m * n - lVar4 == 0) {
        if (tpm != (double *)0x0) {
          for (uVar3 = 0; (uint)(b * b) != uVar3; uVar3 = uVar3 + 1) {
            tpm[uVar3] = 0.0;
          }
LAB_00139435:
          for (sVar5 = 0; sVar8 = 1, sVar5 != n; sVar5 = sVar5 + 1) {
            for (; m != sVar8; sVar8 = sVar8 + 1) {
              lVar4 = (long)series[sVar8] + (long)series[sVar8 - 1] * (long)b;
              tpm[lVar4] = tpm[lVar4] + 1.0;
            }
            series = series + m;
          }
          uVar3 = (ulong)(uint)b;
          pdVar7 = tpm;
          for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
            dVar10 = 0.0;
            for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
              dVar10 = dVar10 + pdVar7[uVar9];
            }
            if ((dVar10 != 0.0) || (NAN(dVar10))) {
              for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
                pdVar7[uVar9] = pdVar7[uVar9] / dVar10;
              }
            }
            else if (err != (inform_error *)0x0) {
              *err = INFORM_ETPMROW;
            }
            pdVar7 = pdVar7 + uVar3;
          }
          return tpm;
        }
        tpm = (double *)calloc((ulong)(uint)(b * b),8);
        if (tpm != (double *)0x0) goto LAB_00139435;
        if (err == (inform_error *)0x0) {
          return (double *)0x0;
        }
        iVar2 = INFORM_ENOMEM;
        goto LAB_00139416;
      }
      puVar1 = (uint *)(series + lVar4);
      if ((int)*puVar1 < 0) {
        if (err == (inform_error *)0x0) {
          return (double *)0x0;
        }
        iVar2 = INFORM_ENEGSTATE;
        goto LAB_00139416;
      }
      lVar4 = lVar4 + 1;
    } while (*puVar1 < (uint)b);
    if (err == (inform_error *)0x0) {
      return (double *)0x0;
    }
    iVar2 = INFORM_EBADSTATE;
  }
LAB_00139416:
  *err = iVar2;
  return (double *)0x0;
}

Assistant:

double *inform_tpm(int const *series, size_t n, size_t m, int b, double *tpm,
    inform_error *err)
{
    if (check_arguments(series, n, m, b, err))
        return NULL;

    if ((tpm = setup_tpm(tpm, b, err)) == NULL)
        return NULL;

    int current = 0, future = 0;
    for (size_t i = 0; i < n; ++i)
    {
        for (size_t j = 0; j < m - 1; ++j)
        {
            current = series[m * i + j];
            future = series[m * i + j + 1];
            tpm[b * current + future] += 1;
        }
    }

    for (int i = 0; i < b; ++i)
    {
        double sum = 0.0;
        for (int j = 0; j < b; ++j)
            sum += tpm[b * i + j];

        if (sum != 0.0)
        {
            for (int j = 0; j < b; ++j)
            {
                tpm[b * i + j] /= sum;
            }
        }
        else
        {
            INFORM_ERROR(err, INFORM_ETPMROW);
        }
    }

    return tpm;
}